

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O0

Aig_Man_t * Fra_FraigEquivence(Aig_Man_t *pManAig,int nConfMax,int fProve)

{
  Aig_Man_t *pAVar1;
  Fra_Par_t *pPars;
  Fra_Par_t Pars;
  Aig_Man_t *pFraig;
  int fProve_local;
  int nConfMax_local;
  Aig_Man_t *pManAig_local;
  
  Fra_ParamsDefault((Fra_Par_t *)&pPars);
  Pars.dActConeBumpMax._0_4_ = 0;
  Pars.fProve = 1;
  Pars.dActConeBumpMax._4_4_ = 0;
  Pars.fSpeculate = 0;
  Pars.fUse1Hot = 1;
  Pars.fChoicing = fProve;
  Pars.fDoSparse = nConfMax;
  pAVar1 = Fra_FraigPerform(pManAig,(Fra_Par_t *)&pPars);
  return pAVar1;
}

Assistant:

Aig_Man_t * Fra_FraigEquivence( Aig_Man_t * pManAig, int nConfMax, int fProve )
{
    Aig_Man_t * pFraig;
    Fra_Par_t Pars, * pPars = &Pars; 
    Fra_ParamsDefault( pPars );
    pPars->nBTLimitNode = nConfMax;
    pPars->fChoicing    = 0;
    pPars->fDoSparse    = 1;
    pPars->fSpeculate   = 0;
    pPars->fProve       = fProve;
    pPars->fVerbose     = 0;
    pPars->fDontShowBar = 1;
    pFraig = Fra_FraigPerform( pManAig, pPars );
    return pFraig;
}